

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O2

void __thiscall xray_re::xr_motion_marks::save(xr_motion_marks *this,xr_writer *w)

{
  undefined1 local_14 [4];
  
  xr_writer::w_s(w,&this->m_name);
  (*w->_vptr_xr_writer[2])(w,local_14,4);
  xr_writer::w_seq<xray_re::xr_motion_marks>(w,this);
  return;
}

Assistant:

void xr_motion_marks::save(xr_writer& w) const
{
	w.w_s(m_name);
	w.w_size_u32(size());
	w.w_seq(*this);
}